

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclTimePerform(SC_Lib *pLib,Abc_Ntk_t *pNtk,int nTreeCRatio,int fUseWireLoads,int fShowAll,
                       int fPrintPath,int fDumpStats)

{
  Abc_Ntk_t *pNtk_00;
  
  pNtk_00 = pNtk;
  if (0 < pNtk->nBarBufs2) {
    pNtk_00 = Abc_NtkDupDfsNoBarBufs(pNtk);
  }
  Abc_SclTimePerformInt(pLib,pNtk_00,nTreeCRatio,fUseWireLoads,fShowAll,fPrintPath,fDumpStats);
  if (0 < pNtk->nBarBufs2) {
    Abc_NtkDelete(pNtk_00);
    return;
  }
  return;
}

Assistant:

void Abc_SclTimePerform( SC_Lib * pLib, Abc_Ntk_t * pNtk, int nTreeCRatio, int fUseWireLoads, int fShowAll, int fPrintPath, int fDumpStats )
{
    Abc_Ntk_t * pNtkNew = pNtk;
    if ( pNtk->nBarBufs2 > 0 )
        pNtkNew = Abc_NtkDupDfsNoBarBufs( pNtk );
    Abc_SclTimePerformInt( pLib, pNtkNew, nTreeCRatio, fUseWireLoads, fShowAll, fPrintPath, fDumpStats );
    if ( pNtk->nBarBufs2 > 0 )
        Abc_NtkDelete( pNtkNew );
}